

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall
QGraphicsScenePrivate::sendMouseEvent
          (QGraphicsScenePrivate *this,QGraphicsSceneMouseEvent *mouseEvent)

{
  QGraphicsItem *pQVar1;
  MouseButton MVar2;
  Int IVar3;
  QGraphicsItem **ppQVar4;
  QWidget *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar5;
  int i;
  QGraphicsItem *item;
  MouseButton button;
  QPointF itemPos;
  QTransform mapFromScene;
  QPointF *in_stack_fffffffffffffe98;
  QGraphicsScenePrivate *in_stack_fffffffffffffea0;
  QWidget *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int iVar6;
  QEvent *in_stack_fffffffffffffeb8;
  QWidget *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  QGraphicsItem **in_stack_fffffffffffffed0;
  QGraphicsItem *in_stack_fffffffffffffed8;
  int local_104;
  QFlagsStorageHelper<Qt::MouseButton,_4> local_5c;
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MVar2 = QGraphicsSceneMouseEvent::button((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffea0);
  bVar5 = false;
  if (MVar2 == NoButton) {
    local_5c.super_QFlagsStorage<Qt::MouseButton>.i =
         (QFlagsStorage<Qt::MouseButton>)
         QGraphicsSceneMouseEvent::buttons((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffea0);
    IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_5c);
    bVar5 = false;
    if (IVar3 == 0) {
      bVar5 = (*(uint *)(in_RDI + 0xb8) >> 0xb & 1) != 0;
    }
  }
  if (bVar5) {
    clearMouseGrabber(in_stack_fffffffffffffea0);
  }
  else {
    ppQVar4 = QList<QGraphicsItem_*>::constLast((QList<QGraphicsItem_*> *)in_stack_fffffffffffffe98)
    ;
    pQVar1 = *ppQVar4;
    bVar5 = QGraphicsItem::isBlockedByModalPanel
                      (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    if (!bVar5) {
      memcpy(local_58,&DAT_00b44b08,0x50);
      QScopedPointer<QGraphicsItemPrivate,_QScopedPointerDeleter<QGraphicsItemPrivate>_>::operator->
                (&pQVar1->d_ptr);
      QGraphicsSceneEvent::widget((QGraphicsSceneEvent *)0x9c7cce);
      QGraphicsItemPrivate::genericMapFromSceneTransform
                ((QGraphicsItemPrivate *)
                 CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                 in_stack_fffffffffffffec0);
      QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffea8);
      QTransform::map((QPointF *)local_58);
      for (local_104 = 1; local_104 < 0x11; local_104 = local_104 << 1) {
        in_stack_fffffffffffffea8 = in_RSI;
        iVar6 = local_104;
        QMap<Qt::MouseButton,_QPointF>::value
                  ((QMap<Qt::MouseButton,_QPointF> *)in_stack_fffffffffffffeb8,
                   (MouseButton *)CONCAT44(local_104,in_stack_fffffffffffffeb0),(QPointF *)in_RSI);
        QGraphicsSceneMouseEvent::setButtonDownPos
                  ((QGraphicsSceneMouseEvent *)CONCAT44(iVar6,in_stack_fffffffffffffeb0),
                   (MouseButton)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (QPointF *)in_stack_fffffffffffffea8);
        in_stack_fffffffffffffeb8 = (QEvent *)(in_RDI + 0x270);
        in_stack_fffffffffffffec0 = in_RSI;
        in_stack_fffffffffffffecc = local_104;
        QGraphicsSceneMouseEvent::scenePos((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffea8);
        QMap<Qt::MouseButton,_QPointF>::value
                  ((QMap<Qt::MouseButton,_QPointF> *)in_stack_fffffffffffffeb8,
                   (MouseButton *)CONCAT44(iVar6,in_stack_fffffffffffffeb0),
                   (QPointF *)in_stack_fffffffffffffea8);
        QGraphicsSceneMouseEvent::setButtonDownScenePos
                  ((QGraphicsSceneMouseEvent *)CONCAT44(iVar6,in_stack_fffffffffffffeb0),
                   (MouseButton)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (QPointF *)in_stack_fffffffffffffea8);
        QGraphicsSceneMouseEvent::screenPos((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffea0);
        QMap<Qt::MouseButton,_QPoint>::value
                  ((QMap<Qt::MouseButton,_QPoint> *)CONCAT44(iVar6,in_stack_fffffffffffffeb0),
                   (MouseButton *)in_stack_fffffffffffffea8,(QPoint *)in_stack_fffffffffffffea0);
        QGraphicsSceneMouseEvent::setButtonDownScreenPos
                  ((QGraphicsSceneMouseEvent *)CONCAT44(iVar6,in_stack_fffffffffffffeb0),
                   (MouseButton)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (QPoint *)in_stack_fffffffffffffea8);
      }
      QGraphicsSceneMouseEvent::setPos
                ((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      QGraphicsSceneMouseEvent::lastScenePos((QGraphicsSceneMouseEvent *)in_stack_fffffffffffffea8);
      QTransform::map((QPointF *)local_58);
      QGraphicsSceneMouseEvent::setLastPos
                ((QGraphicsSceneMouseEvent *)in_RSI,in_stack_fffffffffffffe98);
      sendEvent((QGraphicsScenePrivate *)
                CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                (QGraphicsItem *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsScenePrivate::sendMouseEvent(QGraphicsSceneMouseEvent *mouseEvent)
{
    if (mouseEvent->button() == 0 && mouseEvent->buttons() == 0 && lastMouseGrabberItemHasImplicitMouseGrab) {
        // ### This is a temporary fix for until we get proper mouse
        // grab events.
        clearMouseGrabber();
        return;
    }

    QGraphicsItem *item = mouseGrabberItems.constLast();
    if (item->isBlockedByModalPanel())
        return;

    const QTransform mapFromScene = item->d_ptr->genericMapFromSceneTransform(mouseEvent->widget());
    const QPointF itemPos = mapFromScene.map(mouseEvent->scenePos());
    for (int i = 0x1; i <= 0x10; i <<= 1) {
        Qt::MouseButton button = Qt::MouseButton(i);
        mouseEvent->setButtonDownPos(button, mouseGrabberButtonDownPos.value(button, itemPos));
        mouseEvent->setButtonDownScenePos(button, mouseGrabberButtonDownScenePos.value(button, mouseEvent->scenePos()));
        mouseEvent->setButtonDownScreenPos(button, mouseGrabberButtonDownScreenPos.value(button, mouseEvent->screenPos()));
    }
    mouseEvent->setPos(itemPos);
    mouseEvent->setLastPos(mapFromScene.map(mouseEvent->lastScenePos()));
    sendEvent(item, mouseEvent);
}